

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectAddTypeInfo(Parse *pParse,Select *pSelect)

{
  undefined1 local_48 [8];
  Walker w;
  Select *pSelect_local;
  Parse *pParse_local;
  
  w.xExprCallback = sqlite3SelectWalkNoop;
  w.xSelectCallback = selectAddSubqueryTypeInfo;
  w.pParse = (Parse *)sqlite3ExprWalkNoop;
  local_48 = (undefined1  [8])pParse;
  w.u.pSelect = pSelect;
  sqlite3WalkSelect((Walker *)local_48,pSelect);
  return;
}

Assistant:

static void sqlite3SelectAddTypeInfo(Parse *pParse, Select *pSelect){
#ifndef SQLITE_OMIT_SUBQUERY
  Walker w;
  w.xSelectCallback = sqlite3SelectWalkNoop;
  w.xSelectCallback2 = selectAddSubqueryTypeInfo;
  w.xExprCallback = sqlite3ExprWalkNoop;
  w.pParse = pParse;
  sqlite3WalkSelect(&w, pSelect);
#endif
}